

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O2

panel * get_panel_topleft(void)

{
  panel *p;
  char *pcVar1;
  
  p = panel_allocate(L'\x06');
  panel_line(p,'\x0e',"Name","%s",player->full_name);
  panel_line(p,'\x0e',"Race","%s",player->race->name);
  panel_line(p,'\x0e',"Class","%s",player->class->name);
  if (player->wizard == false) {
    pcVar1 = "***WINNER***";
    if ((player->total_winner == 0) && (player->lev < 0x33)) {
      pcVar1 = player->class->title[(player->lev + -1) / 5];
    }
  }
  else {
    pcVar1 = "[=-WIZARD-=]";
  }
  panel_line(p,'\x0e',"Title","%s",pcVar1);
  panel_line(p,'\x0e',"HP","%d/%d",(ulong)(uint)(int)player->chp,(ulong)(uint)(int)player->mhp);
  panel_line(p,'\x0e',"SP","%d/%d",(ulong)(uint)(int)player->csp,(ulong)(uint)(int)player->msp);
  return p;
}

Assistant:

static struct panel *get_panel_topleft(void) {
	struct panel *p = panel_allocate(6);

	panel_line(p, COLOUR_L_BLUE, "Name", "%s", player->full_name);
	panel_line(p, COLOUR_L_BLUE, "Race",	"%s", player->race->name);
	panel_line(p, COLOUR_L_BLUE, "Class", "%s", player->class->name);
	panel_line(p, COLOUR_L_BLUE, "Title", "%s", show_title());
	panel_line(p, COLOUR_L_BLUE, "HP", "%d/%d", player->chp, player->mhp);
	panel_line(p, COLOUR_L_BLUE, "SP", "%d/%d", player->csp, player->msp);

	return p;
}